

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::anon_unknown_0::CSharpEnumValue_PascalCasedPrefixStripping_Test
::~CSharpEnumValue_PascalCasedPrefixStripping_Test
          (CSharpEnumValue_PascalCasedPrefixStripping_Test *this)

{
  CSharpEnumValue_PascalCasedPrefixStripping_Test *this_local;
  
  ~CSharpEnumValue_PascalCasedPrefixStripping_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CSharpEnumValue, PascalCasedPrefixStripping) {
  EXPECT_EQ("Bar", GetEnumValueName("Foo", "BAR"));
  EXPECT_EQ("BarBaz", GetEnumValueName("Foo", "BAR_BAZ"));
  EXPECT_EQ("Bar", GetEnumValueName("Foo", "FOO_BAR"));
  EXPECT_EQ("Bar", GetEnumValueName("Foo", "FOO__BAR"));
  EXPECT_EQ("BarBaz", GetEnumValueName("Foo", "FOO_BAR_BAZ"));
  EXPECT_EQ("BarBaz", GetEnumValueName("Foo", "Foo_BarBaz"));
  EXPECT_EQ("Bar", GetEnumValueName("FO_O", "FOO_BAR"));
  EXPECT_EQ("Bar", GetEnumValueName("FOO", "F_O_O_BAR"));
  EXPECT_EQ("Bar", GetEnumValueName("Foo", "BAR"));
  EXPECT_EQ("BarBaz", GetEnumValueName("Foo", "BAR_BAZ"));
  EXPECT_EQ("Foo", GetEnumValueName("Foo", "FOO"));
  EXPECT_EQ("Foo", GetEnumValueName("Foo", "FOO___"));
  // Identifiers can't start with digits
  EXPECT_EQ("_2Bar", GetEnumValueName("Foo", "FOO_2_BAR"));
  EXPECT_EQ("_2", GetEnumValueName("Foo", "FOO___2"));
}